

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

ssize_t fio_write2_fn(intptr_t uuid,fio_write_args_s options)

{
  short *psVar1;
  long lVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  code *pcVar6;
  anon_union_8_2_2f6647fd_for_after local_80;
  anon_union_8_2_2f6647fd_for_after local_78;
  long *local_60;
  fio_packet_s **pos;
  undefined8 uStack_50;
  uint8_t was_empty;
  undefined8 local_48;
  undefined8 local_40;
  anon_union_8_2_d0c08f9f_for_data local_38;
  uintptr_t local_30;
  uintptr_t local_28;
  fio_packet_s *local_20;
  fio_packet_s *packet;
  intptr_t uuid_local;
  
  packet = (fio_packet_s *)uuid;
  if (((uuid < 0) || (uVar3 = (uint)((ulong)uuid >> 8), fio_data->capa <= uVar3)) ||
     ((uuid & 0xffU) != (ulong)*(byte *)((long)fio_data + (long)(int)uVar3 * 0xa8 + 0x6d))) {
    if (options.after.dealloc != (_func_void_void_ptr *)0x0) {
      (*options.after.dealloc)(options.data.buffer);
    }
    piVar4 = __errno_location();
    *piVar4 = 9;
    uuid_local = -1;
  }
  else {
    local_20 = fio_packet_alloc();
    uStack_50 = 0;
    local_48 = 0;
    local_40 = 0;
    local_38 = options.data;
    local_30 = options.offset;
    local_28 = options.length;
    memcpy(local_20,&stack0xffffffffffffffb0,0x30);
    iVar5 = (int)((ulong)packet >> 8);
    if (((byte)options._32_1_ >> 1 & 1) == 0) {
      local_20->write_func = fio_sock_write_buffer;
      if (options.after.dealloc == (_func_void_void_ptr *)0x0) {
        local_80.dealloc = free;
      }
      else {
        local_80 = options.after;
      }
      local_20->dealloc = (_func_void_void_ptr *)local_80;
    }
    else {
      pcVar6 = fio_sock_write_from_fd;
      if (*(fio_rw_hook_s **)((long)fio_data + (long)iVar5 * 0xa8 + 0xa8) == &FIO_DEFAULT_RW_HOOKS)
      {
        pcVar6 = fio_sock_sendfile_from_fd;
      }
      local_20->write_func = pcVar6;
      if (options.after.dealloc == (_func_void_void_ptr *)0x0) {
        local_78.dealloc = fio_sock_perform_close_fd;
      }
      else {
        local_78 = options.after;
      }
      local_20->dealloc = (_func_void_void_ptr *)local_78;
    }
    fio_lock((fio_lock_i *)((long)fio_data + (long)iVar5 * 0xa8 + 0x6e));
    uVar3 = (uint)((ulong)packet >> 8);
    if ((((long)packet < 0) || (fio_data->capa <= uVar3)) ||
       (((ulong)packet & 0xff) != (ulong)*(byte *)((long)fio_data + (long)(int)uVar3 * 0xa8 + 0x6d))
       ) {
      fio_unlock((fio_lock_i *)((long)fio_data + (long)(int)uVar3 * 0xa8 + 0x6e));
      fio_packet_free(local_20);
      piVar4 = __errno_location();
      *piVar4 = 9;
      uuid_local = -1;
    }
    else {
      lVar2 = *(long *)((long)fio_data + (long)(int)uVar3 * 0xa8 + 0x40);
      if (((undefined1  [40])options & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
        **(undefined8 **)((long)fio_data + (long)(int)uVar3 * 0xa8 + 0x48) = local_20;
        *(fio_packet_s **)((long)fio_data + (long)(int)uVar3 * 0xa8 + 0x48) = local_20;
      }
      else {
        local_60 = (long *)((long)fio_data + (long)(int)uVar3 * 0xa8 + 0x40);
        if (*local_60 != 0) {
          local_60 = (long *)*local_60;
        }
        local_20->next = (fio_packet_s *)*local_60;
        *local_60 = (long)local_20;
        if (local_20->next == (fio_packet_s *)0x0) {
          *(fio_packet_s **)((long)fio_data + (long)(int)uVar3 * 0xa8 + 0x48) = local_20;
        }
      }
      LOCK();
      psVar1 = (short *)((long)fio_data + (long)(int)uVar3 * 0xa8 + 0x68);
      *psVar1 = *psVar1 + 1;
      UNLOCK();
      fio_unlock((fio_lock_i *)((long)fio_data + (long)(int)uVar3 * 0xa8 + 0x6e));
      if (lVar2 == 0) {
        *(__time_t *)((long)fio_data + (long)(int)((ulong)packet >> 8) * 0xa8 + 0x60) =
             (fio_data->last_cycle).tv_sec;
        deferred_on_ready(packet,&DAT_00000001);
      }
      uuid_local = 0;
    }
  }
  return uuid_local;
}

Assistant:

ssize_t fio_write2_fn(intptr_t uuid, fio_write_args_s options) {
  if (!uuid_is_valid(uuid))
    goto error;

  /* create packet */
  fio_packet_s *packet = fio_packet_alloc();
  *packet = (fio_packet_s){
      .length = options.length,
      .offset = options.offset,
      .data.buffer = (void *)options.data.buffer,
  };
  if (options.is_fd) {
    packet->write_func = (uuid_data(uuid).rw_hooks == &FIO_DEFAULT_RW_HOOKS)
                             ? fio_sock_sendfile_from_fd
                             : fio_sock_write_from_fd;
    packet->dealloc =
        (options.after.dealloc ? options.after.dealloc
                               : (void (*)(void *))fio_sock_perform_close_fd);
  } else {
    packet->write_func = fio_sock_write_buffer;
    packet->dealloc = (options.after.dealloc ? options.after.dealloc : free);
  }
  /* add packet to outgoing list */
  uint8_t was_empty = 1;
  fio_lock(&uuid_data(uuid).sock_lock);
  if (!uuid_is_valid(uuid)) {
    goto locked_error;
  }
  if (uuid_data(uuid).packet)
    was_empty = 0;
  if (options.urgent == 0) {
    *uuid_data(uuid).packet_last = packet;
    uuid_data(uuid).packet_last = &packet->next;
  } else {
    fio_packet_s **pos = &uuid_data(uuid).packet;
    if (*pos)
      pos = &(*pos)->next;
    packet->next = *pos;
    *pos = packet;
    if (!packet->next) {
      uuid_data(uuid).packet_last = &packet->next;
    }
  }
  fio_atomic_add(&uuid_data(uuid).packet_count, 1);
  fio_unlock(&uuid_data(uuid).sock_lock);

  if (was_empty) {
    touchfd(fio_uuid2fd(uuid));
    deferred_on_ready((void *)uuid, (void *)1);
  }
  return 0;
locked_error:
  fio_unlock(&uuid_data(uuid).sock_lock);
  fio_packet_free(packet);
  errno = EBADF;
  return -1;
error:
  if (options.after.dealloc) {
    options.after.dealloc((void *)options.data.buffer);
  }
  errno = EBADF;
  return -1;
}